

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern-computer.cpp
# Opt level: O0

void __thiscall
mahjong::PatternComputer::compute
          (PatternComputer *this,WiningPatterns *out_patterns,WiningHand *out_wining_hand)

{
  bool bVar1;
  WiningPatterns local_b8;
  WiningPatterns *local_88;
  WiningPatterns *patterns;
  WiningHand *h;
  iterator __end1;
  iterator __begin1;
  WiningHands local_58;
  vector<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_> *local_40;
  WiningHands *__range1;
  WiningHandCollator c;
  WiningHand *out_wining_hand_local;
  WiningPatterns *out_patterns_local;
  PatternComputer *this_local;
  
  c.wining_hands.super__Vector_base<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = out_wining_hand;
  std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::clear
            (&this->highest_patterns);
  WiningHandCollator::WiningHandCollator((WiningHandCollator *)&__range1);
  WiningHandCollator::collate(&local_58,(WiningHandCollator *)&__range1,this->hand);
  local_40 = &local_58;
  __end1 = std::vector<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>::begin(local_40);
  h = (WiningHand *)
      std::vector<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>::end(local_40);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<mahjong::WiningHand_*,_std::vector<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>_>
                                *)&h);
    if (!bVar1) break;
    patterns = (WiningPatterns *)
               __gnu_cxx::
               __normal_iterator<mahjong::WiningHand_*,_std::vector<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>_>
               ::operator*(&__end1);
    resetRecognizer(this);
    check(this,(WiningHand *)patterns);
    recognize(&local_b8,this);
    local_88 = &local_b8;
    setHighest(this,(WiningHand *)patterns,local_88);
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::~set
              (&local_b8);
    __gnu_cxx::
    __normal_iterator<mahjong::WiningHand_*,_std::vector<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>_>
    ::operator++(&__end1);
  }
  std::vector<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>::~vector(&local_58);
  special(this,this->hand);
  std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
  operator=(out_patterns,&this->highest_patterns);
  WiningHand::operator=
            (c.wining_hands.
             super__Vector_base<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,&this->highest_wining_hand);
  WiningHandCollator::~WiningHandCollator((WiningHandCollator *)&__range1);
  return;
}

Assistant:

void PatternComputer::compute(WiningPatterns& out_patterns, WiningHand& out_wining_hand)
{
	highest_patterns.clear();

	WiningHandCollator c;
	for (const auto& h : c.collate(hand))
	{
		resetRecognizer();

		check(h);

		const auto& patterns = recognize();
		setHighest(h, patterns);
	}

	special(hand);

	out_patterns = highest_patterns;
	out_wining_hand = highest_wining_hand;
}